

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringFormat.h
# Opt level: O2

void doFormatString<unsigned_char_const>(wstringstream *stream,wchar_t *format,uchar *first)

{
  wchar_t wVar1;
  bool bVar2;
  wchar_t *local_28;
  
  while( true ) {
    wVar1 = *format;
    if (wVar1 == L'\0') {
      return;
    }
    if (wVar1 == L'%') break;
    std::operator<<((wostream *)(stream + 0x10),wVar1);
    format = format + 1;
  }
  local_28 = format + 1;
  bVar2 = doFormatSetup(stream,&local_28);
  if (bVar2) {
    std::wostream::operator<<((wostream *)(stream + 0x10),(uint)*first);
  }
  doFormatString(stream,local_28);
  return;
}

Assistant:

void doFormatString(std::wstringstream& stream, const wchar_t* format, First& first, const Rest&... rest)
{
	while (*format != 0)
	{
		if (*format == '%')
		{
			format++;
			if (doFormatSetup(stream,format))
				stream << first;
			doFormatString(stream,format,rest...);
			return;
		}

		stream << *format++;
	}
}